

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  int iVar4;
  SplayTree SVar5;
  SplayTree sTree_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  SplayTree sTree;
  string line_1;
  string path;
  SplayTree sTree_2;
  string dataset;
  string count_of_elements;
  string operation;
  ifstream input_file;
  byte abStack_420 [488];
  string line;
  
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&path,&kDatasetPath,(allocator<char> *)&input_file);
  poVar3 = std::operator<<((ostream *)&std::cout,"Path to the \'dataset/\' folder: ");
  poVar3 = std::operator<<(poVar3,(string *)&path);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&operation,"remove",(allocator<char> *)&input_file);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&count_of_elements,"5000000",(allocator<char> *)&input_file);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dataset,"01",(allocator<char> *)&input_file);
  bVar1 = std::operator==(&operation,"insert");
  if (bVar1) {
    for (iVar4 = 0; iVar4 != 10; iVar4 = iVar4 + 1) {
      itis::SplayTree::SplayTree(&sTree);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&line,"1",(allocator<char> *)&input_file);
      std::operator+(&local_588,&path,"/insert/");
      std::operator+(&local_568,&local_588,&dataset);
      std::operator+(&local_548,&local_568,"/");
      std::operator+(&local_528,&local_548,&count_of_elements);
      std::operator+(&line_1,&local_528,".csv");
      std::ifstream::ifstream(&input_file,(string *)&line_1,_S_in);
      std::__cxx11::string::~string((string *)&line_1);
      std::__cxx11::string::~string((string *)&local_528);
      std::__cxx11::string::~string((string *)&local_548);
      std::__cxx11::string::~string((string *)&local_568);
      std::__cxx11::string::~string((string *)&local_588);
      std::chrono::_V2::steady_clock::now();
      if ((abStack_420[*(long *)(_input_file + -0x18)] & 5) == 0) {
        while (bVar1 = std::operator!=(&line,""), bVar1) {
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&input_file,(string *)&line);
          bVar1 = std::operator==(&line,"");
          if (bVar1) break;
          iVar2 = std::__cxx11::stoi(&line,(size_t *)0x0,10);
          itis::SplayTree::insert(&sTree,iVar2);
        }
      }
      std::chrono::_V2::steady_clock::now();
      std::ifstream::close();
      poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::ifstream::~ifstream(&input_file);
      std::__cxx11::string::~string((string *)&line);
      itis::SplayTree::~SplayTree(&sTree);
    }
  }
  bVar1 = std::operator==(&operation,"search");
  if (bVar1) {
    for (iVar4 = 0; iVar4 != 10; iVar4 = iVar4 + 1) {
      itis::SplayTree::SplayTree(&sTree_1);
      std::operator+(&line,&path,"/5000000.csv");
      std::ifstream::ifstream(&input_file,(string *)&line,_S_in);
      std::__cxx11::string::~string((string *)&line);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&line_1,"1",(allocator<char> *)&line);
      if ((abStack_420[*(long *)(_input_file + -0x18)] & 5) == 0) {
        while (bVar1 = std::operator!=(&line_1,""), bVar1) {
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&input_file,(string *)&line_1);
          bVar1 = std::operator==(&line_1,"");
          if (bVar1) break;
          iVar2 = std::__cxx11::stoi(&line_1,(size_t *)0x0,10);
          itis::SplayTree::insert(&sTree_1,iVar2);
        }
      }
      std::ifstream::close();
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sTree,
                     &path,"/find/");
      std::operator+(&local_588,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sTree,
                     &dataset);
      std::operator+(&local_568,&local_588,"/");
      std::operator+(&local_548,&local_568,&count_of_elements);
      std::operator+(&local_528,&local_548,".csv");
      std::ifstream::ifstream(&line,(string *)&local_528,_S_in);
      std::ifstream::operator=(&input_file,(ifstream *)&line);
      std::ifstream::~ifstream(&line);
      std::__cxx11::string::~string((string *)&local_528);
      std::__cxx11::string::~string((string *)&local_548);
      std::__cxx11::string::~string((string *)&local_568);
      std::__cxx11::string::~string((string *)&local_588);
      std::__cxx11::string::~string((string *)&sTree);
      std::__cxx11::string::assign((char *)&line_1);
      std::chrono::_V2::steady_clock::now();
      if ((abStack_420[*(long *)(_input_file + -0x18)] & 5) == 0) {
        while (bVar1 = std::operator!=(&line_1,""), bVar1) {
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&input_file,(string *)&line_1);
          bVar1 = std::operator==(&line_1,"");
          if (bVar1) break;
          iVar2 = std::__cxx11::stoi(&line_1,(size_t *)0x0,10);
          itis::SplayTree::search(&sTree_1,iVar2);
        }
      }
      std::chrono::_V2::steady_clock::now();
      std::ifstream::close();
      poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string((string *)&line_1);
      std::ifstream::~ifstream(&input_file);
      itis::SplayTree::~SplayTree(&sTree_1);
    }
  }
  bVar1 = std::operator==(&operation,"remove");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&line_1,"1",(allocator<char> *)&input_file);
    std::operator+(&local_588,&path,"/remove/");
    std::operator+(&local_568,&local_588,&dataset);
    std::operator+(&local_548,&local_568,"/");
    std::operator+(&local_528,&local_548,&count_of_elements);
    std::operator+(&line,&local_528,".csv");
    std::ifstream::ifstream(&input_file,(string *)&line,_S_in);
    std::__cxx11::string::~string((string *)&line);
    std::__cxx11::string::~string((string *)&local_528);
    std::__cxx11::string::~string((string *)&local_548);
    std::__cxx11::string::~string((string *)&local_568);
    std::__cxx11::string::~string((string *)&local_588);
    sTree_1.root = (Node *)0x0;
    if ((abStack_420[*(long *)(_input_file + -0x18)] & 5) == 0) {
      while (bVar1 = std::operator!=(&line_1,""), bVar1) {
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&input_file,(string *)&line_1);
        bVar1 = std::operator==(&line_1,"");
        if (bVar1) break;
        line._M_dataplus._M_p._0_4_ = std::__cxx11::stoi(&line_1,(size_t *)0x0,10);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)&sTree_1,(int *)&line);
      }
    }
    std::ifstream::close();
    std::random_shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)sTree_1.root,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)0x0);
    for (iVar4 = 0; iVar4 != 10; iVar4 = iVar4 + 1) {
      itis::SplayTree::SplayTree(&sTree_2);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sTree,
                     &path,"/remove/");
      std::operator+(&local_588,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sTree,
                     &dataset);
      std::operator+(&local_568,&local_588,"/");
      std::operator+(&local_548,&local_568,&count_of_elements);
      std::operator+(&local_528,&local_548,".csv");
      std::ifstream::ifstream(&line,(string *)&local_528,_S_in);
      std::__cxx11::string::~string((string *)&local_528);
      std::__cxx11::string::~string((string *)&local_548);
      std::__cxx11::string::~string((string *)&local_568);
      std::__cxx11::string::~string((string *)&local_588);
      std::__cxx11::string::~string((string *)&sTree);
      std::__cxx11::string::assign((char *)&line_1);
      while (bVar1 = std::operator!=(&line_1,""), bVar1) {
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&line,(string *)&line_1);
        bVar1 = std::operator==(&line_1,"");
        if (bVar1) break;
        iVar2 = std::__cxx11::stoi(&line_1,(size_t *)0x0,10);
        itis::SplayTree::insert(&sTree_2,iVar2);
      }
      std::ifstream::close();
      std::chrono::_V2::steady_clock::now();
      for (SVar5 = sTree_1; SVar5.root != (Node *)0x0; SVar5.root = (Node *)&(SVar5.root)->field_0x4
          ) {
        itis::SplayTree::remove(&sTree_2,(char *)(ulong)(uint)(SVar5.root)->data);
      }
      std::chrono::_V2::steady_clock::now();
      poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::ifstream::~ifstream(&line);
      itis::SplayTree::~SplayTree(&sTree_2);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&sTree_1);
    std::ifstream::~ifstream(&input_file);
    std::__cxx11::string::~string((string *)&line_1);
  }
  std::__cxx11::string::~string((string *)&dataset);
  std::__cxx11::string::~string((string *)&count_of_elements);
  std::__cxx11::string::~string((string *)&operation);
  std::__cxx11::string::~string((string *)&path);
  return 0;
}

Assistant:

int main() {
  const auto path = string(kDatasetPath);
  cout << "Path to the 'dataset/' folder: " << path << endl;
  // меняете значение переменной operation на ту операцию, которую надо вам проанализировать
  string operation = "remove";
  // в переменной trials - кол-во прогонов
  int trials = 10;
  // ну тут по имени переменной думаю всё понятно
  string count_of_elements = "5000000";
  // номер набора данных, тоже меняете)
  string dataset = "01";
  if (operation == "insert") {
    for (int i = 0; i < trials; i++) {
      SplayTree sTree;
      string line = "1"; // нужна, чтобы прошел первый прогон, так как сначала строка пустая (в следующих операциях точно также)
      // открываем csv файл (в следующих операциях точно также)
      auto input_file = ifstream(path + "/insert/" + dataset + "/" + count_of_elements + ".csv");
      const auto time_point_before = chrono::steady_clock::now();
      // здесь находится участок кода, время которого необходимо замерить
      // заполнение дерева
      if (input_file) {
        while (line != "") {
          getline(input_file, line);
          if (line == "") {
            break;
          }
          sTree.insert(stoi(line)); //используем stoi(string to integer), так как первоначально line имеет тип string
        }
      }
      const auto time_point_after = chrono::steady_clock::now();
      input_file.close();
      const auto time_diff = time_point_after - time_point_before;
      const long time_elapsed_ns = chrono::duration_cast<chrono::nanoseconds>(time_diff).count();
      cout << time_elapsed_ns << endl;
    }
  }
  if (operation == "search") {
    for (int i = 0; i < trials; i++) {
      SplayTree sTree;
      auto input_file = ifstream(path + "/5000000.csv");
      string line = "1";
      // заполнение дерева определенным датасетом с количеством элементов >= количества элемента при поиске
      if (input_file) {
        while (line != "") {
          getline(input_file, line);
          if (line == "") {
            break;
          }
          sTree.insert(stoi(line));
        }
      }
      input_file.close();
      input_file = ifstream(path + "/find/" + dataset + "/" + count_of_elements + ".csv");
      line = "1";
      const auto time_point_before = chrono::steady_clock::now();
      // замер операции поиск
      if (input_file) {
        while (line != "") {
          getline(input_file, line);
          if (line == "") {
            break;
          }
          sTree.search(stoi(line));
        }
      }
      const auto time_point_after = chrono::steady_clock::now();
      input_file.close();
      const auto time_diff = time_point_after - time_point_before;
      const long time_elapsed_ns = chrono::duration_cast<chrono::nanoseconds>(time_diff).count();
      cout << time_elapsed_ns << endl;
    }
  }
  if (operation == "remove") {
    string line = "1";
    auto input_file = ifstream(path + "/remove/" + dataset + "/" + count_of_elements + ".csv");
    // создание вектора
    vector<int> csv;
    //заполнение вектора
    if (input_file) {
      while (line != "") {
        getline(input_file, line);
        if (line == "") {
          break;
        }
        csv.push_back(stoi(line));
      }
    }
    input_file.close();
    //перемешивание вектора
    random_shuffle(csv.begin(), csv.end());
    //прогонка
    for (int i = 0; i < trials; i++) {
      SplayTree sTree;  //создание дерева
      auto input_file = ifstream(path + "/remove/" + dataset + "/" + count_of_elements + ".csv");
      line = "1";
      //заполнение дерева
      while (line != "") {
        getline(input_file, line);
        if (line == "") {
          break;
        }
        sTree.insert(stoi(line));
      }
      input_file.close();
      //замер времени для операции remove
      const auto time_point_before = chrono::steady_clock::now();
      for (int element : csv) {
        sTree.remove(element);
      }
      const auto time_point_after = chrono::steady_clock::now();
      const auto time_diff = time_point_after - time_point_before;
      const long time_elapsed_ns = chrono::duration_cast<chrono::nanoseconds>(time_diff).count();
      cout << time_elapsed_ns << endl;
    }
  }
  return 0;
}